

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

CoverageBinSymbol *
slang::ast::CoverageBinSymbol::fromSyntax(Scope *scope,CoverageBinsSyntax *syntax)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar1;
  SourceLocation scope_00;
  __extent_storage<18446744073709551615UL> this;
  CoverageBinInitializerSyntax *pCVar2;
  SyntaxNode *this_00;
  SyntaxNode *in_RSI;
  Scope *in_RDI;
  string_view sVar3;
  CoverageBinSymbol *result;
  Compilation *comp;
  Token *in_stack_ffffffffffffffb0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb8;
  BumpAllocator *in_stack_ffffffffffffffc0;
  Symbol *this_01;
  pointer ppAVar4;
  
  Scope::getCompilation(in_RDI);
  sVar3 = parsing::Token::valueText(in_stack_ffffffffffffffb0);
  this_01 = (Symbol *)sVar3._M_len;
  ppAVar4 = (pointer)sVar3._M_str;
  scope_00 = parsing::Token::location((Token *)&in_RSI[4].previewNode);
  this._M_extent_value =
       (size_t)BumpAllocator::
               emplace<slang::ast::CoverageBinSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                         (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                          (SourceLocation *)in_stack_ffffffffffffffb0);
  Symbol::setSyntax((Symbol *)this._M_extent_value,in_RSI);
  std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
            ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
             in_RDI,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this._M_extent_value);
  syntax_00._M_extent._M_extent_value = this._M_extent_value;
  syntax_00._M_ptr = ppAVar4;
  Symbol::setAttributes(this_01,(Scope *)scope_00,syntax_00);
  ((CoverageBinSymbol *)this._M_extent_value)->isWildcard = *(short *)&in_RSI[3].parent == 0x14e;
  if ((short)in_RSI[4].kind == EnumType) {
    ((CoverageBinSymbol *)this._M_extent_value)->binsKind = IgnoreBins;
  }
  else if ((short)in_RSI[4].kind == EqualityExpression) {
    ((CoverageBinSymbol *)this._M_extent_value)->binsKind = IllegalBins;
  }
  if (in_RSI[5].parent != (SyntaxNode *)0x0) {
    ((CoverageBinSymbol *)this._M_extent_value)->isArray = true;
  }
  pCVar2 = not_null<slang::syntax::CoverageBinInitializerSyntax_*>::operator->
                     ((not_null<slang::syntax::CoverageBinInitializerSyntax_*> *)0xfb1332);
  if ((pCVar2->super_SyntaxNode).kind == DefaultCoverageBinInitializer) {
    ((CoverageBinSymbol *)this._M_extent_value)->isDefault = true;
    this_00 = &not_null<slang::syntax::CoverageBinInitializerSyntax_*>::operator->
                         ((not_null<slang::syntax::CoverageBinInitializerSyntax_*> *)0xfb1351)->
               super_SyntaxNode;
    slang::syntax::SyntaxNode::as<slang::syntax::DefaultCoverageBinInitializerSyntax>(this_00);
    bVar1 = parsing::Token::operator_cast_to_bool((Token *)0xfb1365);
    if (bVar1) {
      ((CoverageBinSymbol *)this._M_extent_value)->isDefaultSequence = true;
    }
  }
  return (CoverageBinSymbol *)this._M_extent_value;
}

Assistant:

CoverageBinSymbol& CoverageBinSymbol::fromSyntax(const Scope& scope,
                                                 const CoverageBinsSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<CoverageBinSymbol>(syntax.name.valueText(), syntax.name.location());
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);

    result->isWildcard = syntax.wildcard.kind == TokenKind::WildcardKeyword;

    if (syntax.keyword.kind == TokenKind::IgnoreBinsKeyword)
        result->binsKind = IgnoreBins;
    else if (syntax.keyword.kind == TokenKind::IllegalBinsKeyword)
        result->binsKind = IllegalBins;

    if (syntax.size)
        result->isArray = true;

    if (syntax.initializer->kind == SyntaxKind::DefaultCoverageBinInitializer) {
        result->isDefault = true;
        if (syntax.initializer->as<DefaultCoverageBinInitializerSyntax>().sequenceKeyword)
            result->isDefaultSequence = true;
    }

    return *result;
}